

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_SubDEdgeChain::Hash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDEdgeChain *this)

{
  uint uVar1;
  uint uVar2;
  ON_SubDEdgePtr *pOVar3;
  long lVar4;
  ulong uVar5;
  ON__INT32 i;
  ON_SubDEdgePtr eptr;
  ON_SHA1 sha1;
  
  ON_SHA1::ON_SHA1(&sha1);
  uVar1 = EdgeCount(this);
  lVar4 = 0;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    pOVar3 = (ON_SubDEdgePtr *)((long)&((this->m_edge_chain).m_a)->m_ptr + lVar4);
    if ((this->m_edge_chain).m_count <= (int)uVar5) {
      pOVar3 = &ON_SubDEdgePtr::Null;
    }
    if ((int)uVar5 < 0) {
      pOVar3 = &ON_SubDEdgePtr::Null;
    }
    eptr.m_ptr = pOVar3->m_ptr;
    if ((eptr.m_ptr & 0xfffffffffffffff8) == 0) {
      i = 0;
    }
    else {
      i = *(ON__INT32 *)((eptr.m_ptr & 0xfffffffffffffff8) + 8);
    }
    ON_SHA1::AccumulateInteger32(&sha1,i);
    uVar2 = ON_SubDEdgePtr::RelativeVertexId(&eptr,0);
    ON_SHA1::AccumulateInteger32(&sha1,uVar2);
    uVar2 = ON_SubDEdgePtr::RelativeVertexId(&eptr,1);
    ON_SHA1::AccumulateInteger32(&sha1,uVar2);
    lVar4 = lVar4 + 8;
  }
  ON_SHA1::Hash(__return_storage_ptr__,&sha1);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDEdgeChain::Hash() const
{
  ON_SHA1 sha1;
  const unsigned edge_count = this->EdgeCount();
  for (unsigned i = 0; i < edge_count; ++i)
  {
    const ON_SubDEdgePtr eptr = EdgePtr(i);
    sha1.AccumulateInteger32(eptr.EdgeId());
    sha1.AccumulateInteger32(eptr.RelativeVertexId(0));
    sha1.AccumulateInteger32(eptr.RelativeVertexId(1));
  }
  return sha1.Hash();
}